

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

SingleOperationStatistics * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::
calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
          (SingleOperationStatistics *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
          *samples,offset_in_SampleType_to_deUint64 target)

{
  long lVar1;
  long lVar2;
  unsigned_long *puVar3;
  long lVar4;
  float fVar5;
  allocator_type local_41;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,(*(long *)(this + 8) - *(long *)this) / 0x38,&local_41);
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  puVar3 = (unsigned_long *)
           ((long)&(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar1);
  for (lVar4 = 0; lVar4 < (int)((lVar2 - lVar1) / 0x38); lVar4 = lVar4 + 1) {
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = *puVar3;
    puVar3 = puVar3 + 7;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __return_storage_ptr__->minTime =
       (float)*values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
  __return_storage_ptr__->maxTime =
       (float)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  __return_storage_ptr__->medianTime = fVar5;
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  __return_storage_ptr__->min2DecileTime = fVar5;
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  __return_storage_ptr__->max9DecileTime = fVar5;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

SingleOperationStatistics calculateSingleOperationStatistics (const std::vector<T>& samples, deUint64 T::SampleType::*target)
{
	SingleOperationStatistics	stats;
	std::vector<deUint64>		values(samples.size());

	for (int ndx = 0; ndx < (int)samples.size(); ++ndx)
		values[ndx] = samples[ndx].duration.*target;

	std::sort(values.begin(), values.end());

	stats.minTime			= (float)values.front();
	stats.maxTime			= (float)values.back();
	stats.medianTime		= linearSample(values, 0.5f);
	stats.min2DecileTime	= linearSample(values, 0.1f);
	stats.max9DecileTime	= linearSample(values, 0.9f);

	return stats;
}